

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O2

Args * Args::parse(Args *__return_storage_ptr__,int argc,char **argv)

{
  allocator local_7ec;
  allocator local_7eb;
  allocator local_7ea;
  allocator local_7e9;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inputArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  SwitchArg mipsKernelToUserArg;
  SwitchArg mipsUserToKernelArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  printSymbolValueArg;
  SwitchArg printEntryArg;
  SwitchArg printLowestVaddrArg;
  SwitchArg printHighestVaddrArg;
  CmdLine cmdLine;
  ValueArg<int> roundToPageArg;
  
  (__return_storage_ptr__->printSymbolValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->printSymbolValue).field_2;
  (__return_storage_ptr__->printSymbolValue)._M_string_length = 0;
  (__return_storage_ptr__->printSymbolValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->input)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->input).field_2;
  (__return_storage_ptr__->input)._M_string_length = 0;
  (__return_storage_ptr__->input).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&printSymbolValueArg,"object info printer",(allocator *)&roundToPageArg);
  std::__cxx11::string::string((string *)&inputArg,"0.1",(allocator *)&printHighestVaddrArg);
  TCLAP::CmdLine::CmdLine(&cmdLine,(string *)&printSymbolValueArg,' ',(string *)&inputArg,true);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::~string((string *)&printSymbolValueArg);
  std::__cxx11::string::string((string *)&printSymbolValueArg,"r",(allocator *)&printLowestVaddrArg)
  ;
  std::__cxx11::string::string
            ((string *)&inputArg,"round-to-page",(allocator *)&mipsUserToKernelArg);
  std::__cxx11::string::string
            ((string *)&printHighestVaddrArg,"Round output up",(allocator *)&mipsKernelToUserArg);
  std::__cxx11::string::string((string *)&printEntryArg,"bytes",(allocator *)&local_7e8);
  TCLAP::ValueArg<int>::ValueArg
            (&roundToPageArg,(string *)&printSymbolValueArg,(string *)&inputArg,
             (string *)&printHighestVaddrArg,false,0,(string *)&printEntryArg,
             &cmdLine.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&printEntryArg);
  std::__cxx11::string::~string((string *)&printHighestVaddrArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::~string((string *)&printSymbolValueArg);
  std::__cxx11::string::string((string *)&printSymbolValueArg,">",(allocator *)&printLowestVaddrArg)
  ;
  std::__cxx11::string::string
            ((string *)&inputArg,"highest-vaddr",(allocator *)&mipsUserToKernelArg);
  std::__cxx11::string::string
            ((string *)&printEntryArg,"Display highest vaddr",(allocator *)&mipsKernelToUserArg);
  TCLAP::SwitchArg::SwitchArg
            (&printHighestVaddrArg,(string *)&printSymbolValueArg,(string *)&inputArg,
             (string *)&printEntryArg,&cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&printEntryArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::~string((string *)&printSymbolValueArg);
  std::__cxx11::string::string((string *)&printSymbolValueArg,"E",(allocator *)&mipsUserToKernelArg)
  ;
  std::__cxx11::string::string((string *)&inputArg,"entrypoint",(allocator *)&mipsKernelToUserArg);
  std::__cxx11::string::string
            ((string *)&printLowestVaddrArg,"Display entrypoint",(allocator *)&local_7e8);
  TCLAP::SwitchArg::SwitchArg
            (&printEntryArg,(string *)&printSymbolValueArg,(string *)&inputArg,
             (string *)&printLowestVaddrArg,&cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&printLowestVaddrArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::~string((string *)&printSymbolValueArg);
  std::__cxx11::string::string((string *)&printSymbolValueArg,"<",(allocator *)&mipsKernelToUserArg)
  ;
  std::__cxx11::string::string((string *)&inputArg,"lowest-vaddr",(allocator *)&local_7e8);
  std::__cxx11::string::string
            ((string *)&mipsUserToKernelArg,"Display lowest vaddr",(allocator *)&local_7c8);
  TCLAP::SwitchArg::SwitchArg
            (&printLowestVaddrArg,(string *)&printSymbolValueArg,(string *)&inputArg,
             (string *)&mipsUserToKernelArg,&cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&mipsUserToKernelArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::~string((string *)&printSymbolValueArg);
  std::__cxx11::string::string((string *)&inputArg,"S",(allocator *)&local_7c8);
  std::__cxx11::string::string
            ((string *)&mipsUserToKernelArg,"symbol-value",(allocator *)&local_7a8);
  std::__cxx11::string::string((string *)&mipsKernelToUserArg,"Display symbol value",&local_7ec);
  std::__cxx11::string::string((string *)&local_658,"",&local_7eb);
  std::__cxx11::string::string((string *)&local_7e8,"sym",&local_7ea);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&printSymbolValueArg,(string *)&inputArg,(string *)&mipsUserToKernelArg,
             (string *)&mipsKernelToUserArg,false,&local_658,&local_7e8,
             &cmdLine.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&mipsKernelToUserArg);
  std::__cxx11::string::~string((string *)&mipsUserToKernelArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::string((string *)&inputArg,"1",(allocator *)&local_7c8);
  std::__cxx11::string::string((string *)&mipsKernelToUserArg,"to-kseg0",(allocator *)&local_7a8);
  std::__cxx11::string::string((string *)&local_7e8,"Convert MIPS VMAs to kseg1",&local_7ec);
  TCLAP::SwitchArg::SwitchArg
            (&mipsUserToKernelArg,(string *)&inputArg,(string *)&mipsKernelToUserArg,&local_7e8,
             &cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&mipsKernelToUserArg);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::string((string *)&inputArg,"0",(allocator *)&local_7a8);
  std::__cxx11::string::string((string *)&local_7e8,"to-kuseg",&local_7ec);
  std::__cxx11::string::string((string *)&local_7c8,"Convert MIPS VMAs to kuseg",&local_7eb);
  TCLAP::SwitchArg::SwitchArg
            (&mipsKernelToUserArg,(string *)&inputArg,&local_7e8,&local_7c8,
             &cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&inputArg);
  std::__cxx11::string::string((string *)&local_7e8,"input",&local_7ec);
  std::__cxx11::string::string((string *)&local_7c8,"Input (default stdin)",&local_7eb);
  std::__cxx11::string::string((string *)&local_678,"-",&local_7ea);
  std::__cxx11::string::string((string *)&local_7a8,"filename",&local_7e9);
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&inputArg,&local_7e8,&local_7c8,false,&local_678,&local_7a8,
                      &cmdLine.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  TCLAP::CmdLine::parse(&cmdLine,argc,argv);
  __return_storage_ptr__->printHighestVaddr = (bool)printHighestVaddrArg.super_Arg._163_1_;
  __return_storage_ptr__->printLowestVaddr = (bool)printLowestVaddrArg.super_Arg._163_1_;
  __return_storage_ptr__->printEntry = (bool)printEntryArg.super_Arg._163_1_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->printSymbolValue);
  __return_storage_ptr__->roundToPage = roundToPageArg.super_Arg._164_4_;
  __return_storage_ptr__->mips0to1 = (bool)mipsUserToKernelArg.super_Arg._163_1_;
  __return_storage_ptr__->mips1to0 = (bool)mipsKernelToUserArg.super_Arg._163_1_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->input);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&inputArg.
               super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  TCLAP::Arg::~Arg(&mipsKernelToUserArg.super_Arg);
  TCLAP::Arg::~Arg(&mipsUserToKernelArg.super_Arg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&printSymbolValueArg);
  TCLAP::Arg::~Arg(&printLowestVaddrArg.super_Arg);
  TCLAP::Arg::~Arg(&printEntryArg.super_Arg);
  TCLAP::Arg::~Arg(&printHighestVaddrArg.super_Arg);
  TCLAP::ValueArg<int>::~ValueArg(&roundToPageArg);
  TCLAP::CmdLine::~CmdLine(&cmdLine);
  return __return_storage_ptr__;
}

Assistant:

static Args parse(int argc, char **argv){
		Args args;

		TCLAP::CmdLine cmdLine("object info printer", ' ', VERSION);
		TCLAP::ValueArg<int> roundToPageArg("r", "round-to-page", "Round output up", false, 0, "bytes", cmdLine);
		TCLAP::SwitchArg printHighestVaddrArg(">", "highest-vaddr", "Display highest vaddr", cmdLine);
		TCLAP::SwitchArg printEntryArg("E", "entrypoint", "Display entrypoint", cmdLine);
		TCLAP::SwitchArg printLowestVaddrArg("<", "lowest-vaddr", "Display lowest vaddr", cmdLine);
		TCLAP::ValueArg<std::string> printSymbolValueArg("S", "symbol-value", "Display symbol value", false, "", "sym", cmdLine);
		TCLAP::SwitchArg mipsUserToKernelArg("1", "to-kseg0", "Convert MIPS VMAs to kseg1", cmdLine);
		TCLAP::SwitchArg mipsKernelToUserArg("0", "to-kuseg", "Convert MIPS VMAs to kuseg", cmdLine);
		TCLAP::UnlabeledValueArg<std::string> inputArg("input", "Input (default stdin)", false, "-", "filename", cmdLine);

		cmdLine.parse(argc, argv);

		args.printHighestVaddr = printHighestVaddrArg.getValue();
		args.printLowestVaddr = printLowestVaddrArg.getValue();
		args.printEntry = printEntryArg.getValue();
		args.printSymbolValue = printSymbolValueArg.getValue();
		args.roundToPage = roundToPageArg.getValue();
		args.mips0to1 = mipsUserToKernelArg.getValue();
		args.mips1to0 = mipsKernelToUserArg.getValue();
		args.input = inputArg.getValue();

		return args;
	}